

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O2

ostream * vkt::sr::anon_unknown_0::operator<<(ostream *stream,TextureSwizzleComponent comp)

{
  ostream *poVar1;
  
  if (comp < TEXTURESWIZZLECOMPONENT_LAST) {
    poVar1 = std::operator<<(stream,&DAT_009c1ee4 + *(int *)(&DAT_009c1ee4 + (ulong)comp * 4));
    return poVar1;
  }
  return stream;
}

Assistant:

static std::ostream& operator<< (std::ostream& stream, TextureSwizzleComponent comp)
{
	switch (comp)
	{
		case TEXTURESWIZZLECOMPONENT_R:		return stream << "RED";
		case TEXTURESWIZZLECOMPONENT_G:		return stream << "GREEN";
		case TEXTURESWIZZLECOMPONENT_B:		return stream << "BLUE";
		case TEXTURESWIZZLECOMPONENT_A:		return stream << "ALPHA";
		case TEXTURESWIZZLECOMPONENT_ZERO:	return stream << "ZERO";
		case TEXTURESWIZZLECOMPONENT_ONE:	return stream << "ONE";
		default: DE_ASSERT(false); return stream;
	}
}